

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack(QXmlStreamPrivateTagStack *this)

{
  QAnyStringView s;
  QAnyStringView s_00;
  QXmlStreamPrivateTagStack *pQVar1;
  QAnyStringView *this_00;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_RDI;
  long in_FS_OFFSET;
  NamespaceDeclaration *namespaceDeclaration;
  size_t RuntimeThreshold;
  size_t i;
  size_t RuntimeThreshold_1;
  size_t i_1;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_stack_fffffffffffffec0;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag> *in_stack_fffffffffffffec8;
  char16_t *str;
  QAnyStringView *in_stack_fffffffffffffed0;
  qsizetype in_stack_fffffffffffffee8;
  QXmlStreamPrivateTagStack *this_01;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *pQVar3;
  ulong local_98;
  ulong local_70;
  ulong local_60;
  char16_t local_58 [8];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  qsizetype local_38;
  NamespaceDeclaration *local_20;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::QXmlStreamSimpleStack
            (in_RDI);
  aVar2.m_data = pQVar3 + 1;
  QString::QString((QString *)0x647b1b);
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::QXmlStreamSimpleStack
            ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag> *)(pQVar3 + 3));
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::reserve
            (in_stack_fffffffffffffec8,(qsizetype)in_stack_fffffffffffffec0);
  QString::reserve((QString *)in_stack_fffffffffffffed0,in_stack_fffffffffffffee8);
  in_RDI[2].data = (NamespaceDeclaration *)0x0;
  pQVar1 = (QXmlStreamPrivateTagStack *)
           QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                     (in_stack_fffffffffffffec0);
  this_01 = pQVar1;
  std::data<char16_t_const,4ul>((char16_t (*) [4])L"xml");
  for (local_98 = 0; (local_98 < 4 && (L"xml"[local_98] != L'\0')); local_98 = local_98 + 1) {
  }
  QAnyStringView::QAnyStringView<char16_t,_true>
            (in_stack_fffffffffffffed0,(char16_t *)in_stack_fffffffffffffec8,
             (qsizetype)in_stack_fffffffffffffec0);
  s.m_size = (size_t)pQVar3;
  s.field_0.m_data = aVar2.m_data;
  addToStringStorage(this_01,s);
  (pQVar1->namespaceDeclarations).data = local_20;
  (pQVar1->namespaceDeclarations).tos = local_18;
  (pQVar1->namespaceDeclarations).cap = local_10;
  str = local_58;
  this_00 = (QAnyStringView *)
            std::data<char16_t_const,37ul>
                      ((char16_t (*) [37])L"http://www.w3.org/XML/1998/namespace");
  local_70 = 0;
  do {
    if (0x24 < local_70) {
      local_60 = 0x25;
LAB_00647da3:
      QAnyStringView::QAnyStringView<char16_t,_true>(this_00,str,local_60);
      s_00.m_size = (size_t)pQVar3;
      s_00.field_0.m_data = aVar2.m_data;
      addToStringStorage(this_01,s_00);
      ((XmlStringRef *)&pQVar1->tagStackStringStorage)->m_size = local_38;
      *(undefined4 *)&((XmlStringRef *)&pQVar1->tagStackStringStorage)->m_string = local_48;
      *(undefined4 *)((long)&((XmlStringRef *)&pQVar1->tagStackStringStorage)->m_string + 4) =
           uStack_44;
      *(undefined4 *)&((XmlStringRef *)&pQVar1->tagStackStringStorage)->m_pos = uStack_40;
      *(undefined4 *)((long)&((XmlStringRef *)&pQVar1->tagStackStringStorage)->m_pos + 4) =
           uStack_3c;
      in_RDI[2].tos = (qsizetype)in_RDI[2].data;
      *(undefined1 *)&in_RDI[2].cap = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    if (L"http://www.w3.org/XML/1998/namespace"[local_70] == L'\0') {
      local_60 = local_70;
      goto LAB_00647da3;
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack()
{
    tagStack.reserve(16);
    tagStackStringStorage.reserve(32);
    tagStackStringStorageSize = 0;
    NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
    namespaceDeclaration.prefix = addToStringStorage(u"xml");
    namespaceDeclaration.namespaceUri = addToStringStorage(u"http://www.w3.org/XML/1998/namespace");
    initialTagStackStringStorageSize = tagStackStringStorageSize;
    tagsDone = false;
}